

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void __thiscall google::protobuf::internal::LogMessage::Finish(LogMessage *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  FatalException *this_00;
  bool suppress;
  LogMessage *this_local;
  
  bVar1 = false;
  if (this->level_ != LOGLEVEL_DFATAL) {
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&log_silencer_count_);
    bVar1 = 0 < _Var2;
  }
  if (!bVar1) {
    (*(code *)log_handler__abi_cxx11_)(this->level_,this->filename_,this->line_,&this->message_);
  }
  if (this->level_ == LOGLEVEL_DFATAL) {
    this_00 = (FatalException *)__cxa_allocate_exception(0x38);
    FatalException::FatalException(this_00,this->filename_,this->line_,&this->message_);
    __cxa_throw(this_00,&FatalException::typeinfo,FatalException::~FatalException);
  }
  return;
}

Assistant:

void LogMessage::Finish() {
  bool suppress = false;

  if (level_ != LOGLEVEL_FATAL) {
    suppress = log_silencer_count_ > 0;
  }

  if (!suppress) {
    log_handler_(level_, filename_, line_, message_);
  }

  if (level_ == LOGLEVEL_FATAL) {
#if PROTOBUF_USE_EXCEPTIONS
    throw FatalException(filename_, line_, message_);
#else
    abort();
#endif
  }
}